

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool AppInitParameterInteraction(ArgsManager *args)

{
  path *this;
  long lVar1;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  string original_05;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  __index_type _Var2;
  bool bVar3;
  bool bVar4;
  ChainType chain;
  int iVar5;
  CChainParams *pCVar6;
  _Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
  *__x;
  size_type sVar7;
  int64_t iVar8;
  uint uVar9;
  Options *pOVar10;
  bilingual_str *pbVar11;
  uint *opts;
  uint uVar12;
  long lVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  bilingual_str *in_R8;
  char *in_R9;
  long lVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  optional<long> oVar16;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  ArgsManager *this_00;
  ChainType CVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 uVar19;
  undefined8 in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  undefined8 in_stack_fffffffffffffb80;
  pointer pbVar21;
  Notifications in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  bilingual_str local_468;
  BlockFilterType filter_type;
  _Rb_tree_node_base local_420;
  __index_type local_3e8;
  Options blockman_opts_dummy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_350;
  Result<void> result;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  string blockfilterindex_value;
  string local_1b8 [32];
  bilingual_str local_198;
  bilingual_str local_158;
  bilingual_str warnings;
  string local_d8 [32];
  bilingual_str local_b8;
  bilingual_str errors;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = Params();
  chain = ArgsManager::GetChainType(args);
  if (chain == SIGNET) {
    fmt = (char *)0x6f1bd1;
    s.m_size = 4;
    s.m_data = (pCVar6->pchMessageStart)._M_elems;
    HexStr_abi_cxx11_((string *)&result,s);
    in_R9 = "Signet derived magic (message start): %s\n";
    in_R8 = (bilingual_str *)0x38b;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file._M_len = 0x51;
    logging_function._M_str = "AppInitParameterInteraction";
    logging_function._M_len = 0x1b;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x38b,
               IPC|I2P|QT|LIBEVENT|PROXY|RAND|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|ZMQ|BENCH
               |MEMPOOL|TOR,(Level)(string *)&result,fmt,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string((string *)&result);
  }
  errors.original._M_dataplus._M_p = (pointer)&errors.original.field_2;
  errors.original._M_string_length = 0;
  errors.original.field_2._M_local_buf[0] = '\0';
  errors.translated._M_dataplus._M_p = (pointer)&errors.translated.field_2;
  errors.translated._M_string_length = 0;
  errors.translated.field_2._M_local_buf[0] = '\0';
  ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&filter_type,args);
  while (local_420._M_left != &local_420) {
    _(&local_b8,(ConstevalStringLiteral)0xcaa820);
    std::__cxx11::string::string<std::allocator<char>>
              (local_d8,"\n",(allocator<char> *)&blockfilterindex_value);
    original._M_string_length = (size_type)args;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    original.field_2._M_allocated_capacity._0_4_ = chain;
    original.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    original.field_2._8_8_ = in_stack_fffffffffffffb70;
    Untranslated((bilingual_str *)&names,original);
    lhs.original._M_string_length = (size_type)args;
    lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    lhs.original.field_2._M_allocated_capacity._0_4_ = chain;
    lhs.original.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    lhs.original.field_2._8_8_ = in_stack_fffffffffffffb70;
    lhs.translated._M_dataplus._M_p = (pointer)pCVar6;
    lhs.translated._M_string_length = in_stack_fffffffffffffb80;
    lhs.translated.field_2._M_allocated_capacity =
         (size_type)in_stack_fffffffffffffb88._vptr_Notifications;
    lhs.translated.field_2._8_8_ = in_stack_fffffffffffffb90;
    operator+((bilingual_str *)&blockman_opts_dummy,lhs,&local_b8);
    CVar17 = chain;
    ChainTypeToString_abi_cxx11_(&warnings.original,chain);
    ChainTypeToString_abi_cxx11_(&local_468.original,chain);
    in_R8 = &local_468;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
               (bilingual_str *)(local_420._M_left + 1),&warnings.original,&local_468.original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9);
    bilingual_str::operator+=(&errors,(bilingual_str *)&result);
    bilingual_str::~bilingual_str((bilingual_str *)&result);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&warnings);
    bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
    bilingual_str::~bilingual_str((bilingual_str *)&names);
    std::__cxx11::string::~string(local_d8);
    bilingual_str::~bilingual_str(&local_b8);
    local_420._M_left = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)local_420._M_left);
    chain = CVar17;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&filter_type);
  if (errors.original._M_string_length != 0) {
    bVar3 = InitError(&errors);
    goto LAB_006f2788;
  }
  if (chain == TESTNET) {
    in_R9 = (char *)0xffffffffffffffff;
    in_R8 = (bilingual_str *)0x398;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file_00._M_len = 0x51;
    logging_function_00._M_str = "AppInitParameterInteraction";
    logging_function_00._M_len = 0x1b;
    LogPrintf_<>(logging_function_00,source_file_00,0x398,ALL,Info,
                 "Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n"
                );
  }
  warnings.original._M_dataplus._M_p = (pointer)&warnings.original.field_2;
  warnings.original._M_string_length = 0;
  warnings.original.field_2._M_local_buf[0] = '\0';
  warnings.translated._M_dataplus._M_p = (pointer)&warnings.translated.field_2;
  warnings.translated._M_string_length = 0;
  warnings.translated.field_2._M_local_buf[0] = '\0';
  pbVar11 = &local_468;
  ArgsManager::GetUnrecognizedSections_abi_cxx11_
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)pbVar11,args);
  while( true ) {
    bVar3 = false;
    pbVar11 = (bilingual_str *)
              (((_List_impl *)&(pbVar11->original)._M_dataplus)->_M_node).super__List_node_base.
              _M_next;
    if (pbVar11 == &local_468) break;
    std::__cxx11::string::string<std::allocator<char>>
              (local_1b8,"%s:%i ",(allocator<char> *)&blockfilterindex_value);
    original_00._M_string_length = (size_type)args;
    original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    original_00.field_2._M_allocated_capacity._0_4_ = chain;
    original_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    original_00.field_2._8_8_ = in_stack_fffffffffffffb70;
    Untranslated(&local_198,original_00);
    _((bilingual_str *)&names,(ConstevalStringLiteral)0xcaa8e7);
    lhs_00.original._M_string_length = (size_type)args;
    lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    lhs_00.original.field_2._M_allocated_capacity._0_4_ = chain;
    lhs_00.original.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    lhs_00.original.field_2._8_8_ = in_stack_fffffffffffffb70;
    lhs_00.translated._M_dataplus._M_p = (pointer)pCVar6;
    lhs_00.translated._M_string_length = in_stack_fffffffffffffb80;
    lhs_00.translated.field_2._M_allocated_capacity =
         (size_type)in_stack_fffffffffffffb88._vptr_Notifications;
    lhs_00.translated.field_2._8_8_ = in_stack_fffffffffffffb90;
    operator+(&local_158,lhs_00,&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe28,"\n",(allocator<char> *)&stack0xfffffffffffffb88);
    original_01._M_string_length = (size_type)args;
    original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    original_01.field_2._M_allocated_capacity._0_4_ = chain;
    original_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    original_01.field_2._8_8_ = in_stack_fffffffffffffb70;
    Untranslated((bilingual_str *)&filter_type,original_01);
    lhs_01.original._M_string_length = (size_type)args;
    lhs_01.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
    lhs_01.original.field_2._M_allocated_capacity._0_4_ = chain;
    lhs_01.original.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
    lhs_01.original.field_2._8_8_ = in_stack_fffffffffffffb70;
    lhs_01.translated._M_dataplus._M_p = (pointer)pCVar6;
    lhs_01.translated._M_string_length = in_stack_fffffffffffffb80;
    lhs_01.translated.field_2._M_allocated_capacity =
         (size_type)in_stack_fffffffffffffb88._vptr_Notifications;
    lhs_01.translated.field_2._8_8_ = in_stack_fffffffffffffb90;
    operator+((bilingual_str *)&blockman_opts_dummy,lhs_01,&local_158);
    in_R8 = (bilingual_str *)&(pbVar11->original).field_2;
    tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
              ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
               (bilingual_str *)&(pbVar11->translated).field_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pbVar11[1].original.field_2,(int *)in_R8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9);
    bilingual_str::operator+=(&warnings,(bilingual_str *)&result);
    bilingual_str::~bilingual_str((bilingual_str *)&result);
    bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
    bilingual_str::~bilingual_str((bilingual_str *)&filter_type);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    bilingual_str::~bilingual_str(&local_158);
    bilingual_str::~bilingual_str((bilingual_str *)&names);
    bilingual_str::~bilingual_str(&local_198);
    std::__cxx11::string::~string(local_1b8);
  }
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            ((_List_base<SectionInfo,_std::allocator<SectionInfo>_> *)&local_468);
  if (warnings.original._M_string_length != 0) {
    InitWarning(&warnings);
  }
  ArgsManager::GetBlocksDirPath((path *)&result,args);
  bVar4 = std::filesystem::is_directory((path *)&result);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"-blockfilterindex",(allocator<char> *)&names);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockman_opts_dummy,"0",(allocator<char> *)&filter_type);
    pOVar10 = &blockman_opts_dummy;
    ArgsManager::GetArg(&blockfilterindex_value,args,(string *)&result,(string *)pOVar10);
    std::__cxx11::string::~string((string *)&blockman_opts_dummy);
    std::__cxx11::string::~string((string *)&result);
    bVar4 = std::operator==(&blockfilterindex_value,"");
    if ((!bVar4) && (bVar4 = std::operator==(&blockfilterindex_value,"1"), !bVar4)) {
      bVar4 = std::operator==(&blockfilterindex_value,"0");
      if (bVar4) goto LAB_006f2071;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-blockfilterindex",(allocator<char> *)&blockman_opts_dummy);
      ArgsManager::GetArgs(&names,args,(string *)&result);
      std::__cxx11::string::~string((string *)&result);
      pbVar21 = names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar11 = (bilingual_str *)
                     names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar11 != (bilingual_str *)pbVar21;
          pbVar11 = (bilingual_str *)&pbVar11->translated) {
        bVar4 = BlockFilterTypeByName(&pbVar11->original,&filter_type);
        if (!bVar4) {
          _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xcaa954);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,pbVar11,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar10);
          bVar3 = InitError((bilingual_str *)&result);
          bilingual_str::~bilingual_str((bilingual_str *)&result);
          bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
          break;
        }
        std::
        _Rb_tree<BlockFilterType,BlockFilterType,std::_Identity<BlockFilterType>,std::less<BlockFilterType>,std::allocator<BlockFilterType>>
        ::_M_insert_unique<BlockFilterType_const&>
                  ((_Rb_tree<BlockFilterType,BlockFilterType,std::_Identity<BlockFilterType>,std::less<BlockFilterType>,std::allocator<BlockFilterType>>
                    *)(anonymous_namespace)::g_enabled_filter_types,&filter_type);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      if (pbVar11 == (bilingual_str *)pbVar21) goto LAB_006f2071;
      goto LAB_006f276e;
    }
    __x = &AllBlockFilterTypes()->_M_t;
    std::
    _Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
    ::operator=((_Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                 *)(anonymous_namespace)::g_enabled_filter_types,__x);
LAB_006f2071:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"-v2transport",(allocator<char> *)&blockman_opts_dummy);
    bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,true);
    std::__cxx11::string::~string((string *)&result);
    if (bVar4) {
      (anonymous_namespace)::nLocalServices._1_1_ = (anonymous_namespace)::nLocalServices._1_1_ | 8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"-peerblockfilters",(allocator<char> *)&blockman_opts_dummy);
    bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,false);
    std::__cxx11::string::~string((string *)&result);
    if (bVar4) {
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ &
           0xffffffffffffff00;
      sVar7 = std::
              set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>::
              count((set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                     *)(anonymous_namespace)::g_enabled_filter_types,(key_type *)&result);
      if (sVar7 == 1) {
        (anonymous_namespace)::nLocalServices._0_1_ =
             (byte)(anonymous_namespace)::nLocalServices | 0x40;
        goto LAB_006f2127;
      }
      _((bilingual_str *)&result,(ConstevalStringLiteral)0xcaa978);
      bVar3 = InitError((bilingual_str *)&result);
LAB_006f275f:
      bilingual_str::~bilingual_str((bilingual_str *)&result);
    }
    else {
LAB_006f2127:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-prune",(allocator<char> *)&blockman_opts_dummy);
      iVar8 = ArgsManager::GetIntArg(args,(string *)&result,0);
      std::__cxx11::string::~string((string *)&result);
      if (iVar8 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"-txindex",(allocator<char> *)&blockman_opts_dummy);
        bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,false);
        std::__cxx11::string::~string((string *)&result);
        if (bVar4) {
          _((bilingual_str *)&result,(ConstevalStringLiteral)0xcaa9b7);
          bVar3 = InitError((bilingual_str *)&result);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"-reindex-chainstate",(allocator<char> *)&blockman_opts_dummy
                    );
          bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,false);
          std::__cxx11::string::~string((string *)&result);
          if (!bVar4) goto LAB_006f23eb;
          _((bilingual_str *)&result,(ConstevalStringLiteral)0xcaa9e1);
          bVar3 = InitError((bilingual_str *)&result);
        }
        goto LAB_006f275f;
      }
LAB_006f23eb:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-forcednsseed",(allocator<char> *)&names);
      bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,false);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockman_opts_dummy,"-dnsseed",(allocator<char> *)&filter_type);
        bVar4 = ArgsManager::GetBoolArg(args,(string *)&blockman_opts_dummy,true);
        std::__cxx11::string::~string((string *)&blockman_opts_dummy);
        std::__cxx11::string::~string((string *)&result);
        if (!bVar4) {
          _((bilingual_str *)&result,(ConstevalStringLiteral)0xcaaa31);
          bVar3 = InitError((bilingual_str *)&result);
          goto LAB_006f275f;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&result);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-bind",(allocator<char> *)&local_468);
      ArgsManager::GetArgs(&names,args,(string *)&result);
      lVar13 = (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockman_opts_dummy,"-whitebind",
                 (allocator<char> *)&stack0xfffffffffffffb88);
      ArgsManager::GetArgs
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&filter_type,args,(string *)&blockman_opts_dummy);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filter_type);
      std::__cxx11::string::~string((string *)&blockman_opts_dummy);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      std::__cxx11::string::~string((string *)&result);
      lVar13 = ((long)(local_420._0_8_ - _filter_type) >> 5) + (lVar13 >> 5);
      if (lVar13 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"-listen",(allocator<char> *)&blockman_opts_dummy);
        bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,true);
        std::__cxx11::string::~string((string *)&result);
        if (bVar4) goto LAB_006f25ac;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218,"Cannot set -bind or -whitebind together with -listen=0",
                   (allocator<char> *)&blockman_opts_dummy);
        original_03._M_string_length = (size_type)args;
        original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
        original_03.field_2._M_allocated_capacity._0_4_ = chain;
        original_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
        original_03.field_2._8_8_ = in_stack_fffffffffffffb70;
        Untranslated((bilingual_str *)&result,original_03);
        bVar3 = InitError((bilingual_str *)&result);
        bilingual_str::~bilingual_str((bilingual_str *)&result);
        pOVar10 = (Options *)local_218;
        goto LAB_006f2819;
      }
LAB_006f25ac:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-listen",(allocator<char> *)&names);
      bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,true);
      if (bVar4) {
        std::__cxx11::string::~string((string *)&result);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockman_opts_dummy,"-listenonion",(allocator<char> *)&filter_type);
        bVar4 = ArgsManager::GetBoolArg(args,(string *)&blockman_opts_dummy,true);
        std::__cxx11::string::~string((string *)&blockman_opts_dummy);
        std::__cxx11::string::~string((string *)&result);
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,"Cannot set -listen=0 together with -listenonion=1",
                     (allocator<char> *)&blockman_opts_dummy);
          original_02._M_string_length = (size_type)args;
          original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
          original_02.field_2._M_allocated_capacity._0_4_ = chain;
          original_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
          original_02.field_2._8_8_ = in_stack_fffffffffffffb70;
          Untranslated((bilingual_str *)&result,original_02);
          bVar3 = InitError((bilingual_str *)&result);
          bilingual_str::~bilingual_str((bilingual_str *)&result);
          pOVar10 = (Options *)local_238;
          goto LAB_006f2819;
        }
      }
      iVar5 = (int)lVar13 + (uint)(lVar13 == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"-maxconnections",(allocator<char> *)&blockman_opts_dummy);
      iVar8 = ArgsManager::GetIntArg(args,(string *)&result,0x7d);
      (anonymous_namespace)::nUserMaxConnections = (uint)iVar8;
      std::__cxx11::string::~string((string *)&result);
      (anonymous_namespace)::nMaxConnections = (anonymous_namespace)::nUserMaxConnections;
      if ((int)(anonymous_namespace)::nUserMaxConnections < 1) {
        (anonymous_namespace)::nMaxConnections = 0;
      }
      (anonymous_namespace)::nFD =
           RaiseFileDescriptorLimit(iVar5 + (anonymous_namespace)::nMaxConnections + 0x9f);
      uVar9 = ((anonymous_namespace)::nFD - iVar5) - 0x9f;
      if ((int)(anonymous_namespace)::nMaxConnections <= (int)uVar9) {
        uVar9 = (anonymous_namespace)::nMaxConnections;
      }
      opts = (uint *)(ulong)uVar9;
      uVar12 = 0;
      if (0 < (int)uVar9) {
        uVar12 = uVar9;
      }
      if ((anonymous_namespace)::nFD < 0x96) {
        (anonymous_namespace)::nMaxConnections = uVar12;
        _((bilingual_str *)&result,(ConstevalStringLiteral)0xcaaadb);
        bVar3 = InitError((bilingual_str *)&result);
        goto LAB_006f275f;
      }
      (anonymous_namespace)::nMaxConnections = (anonymous_namespace)::nFD - 0x9fU;
      if ((int)uVar12 < (int)((anonymous_namespace)::nFD - 0x9fU)) {
        (anonymous_namespace)::nMaxConnections = uVar12;
      }
      if ((int)(anonymous_namespace)::nMaxConnections <
          (int)(anonymous_namespace)::nUserMaxConnections) {
        _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xcaab02);
        opts = &(anonymous_namespace)::nMaxConnections;
        tinyformat::format<int,int>
                  ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
                   (bilingual_str *)&(anonymous_namespace)::nUserMaxConnections,
                   (int *)&(anonymous_namespace)::nMaxConnections,(int *)in_R8);
        InitWarning((bilingual_str *)&result);
        bilingual_str::~bilingual_str((bilingual_str *)&result);
        bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
      }
      init::SetLoggingCategories(&result,args);
      _Var2 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index;
      if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
        util::ErrorString<void>((bilingual_str *)&blockman_opts_dummy,&result);
        bVar3 = InitError((bilingual_str *)&blockman_opts_dummy);
        bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
      if (_Var2 == '\x01') {
        init::SetLoggingLevel(&result,args);
        if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
          util::ErrorString<void>((bilingual_str *)&blockman_opts_dummy,&result);
          bVar3 = InitError((bilingual_str *)&blockman_opts_dummy);
          bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
        if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"-timeout",(allocator<char> *)&blockman_opts_dummy);
          iVar8 = ArgsManager::GetIntArg(args,(string *)&result,5000);
          nConnectTimeout = (int)iVar8;
          std::__cxx11::string::~string((string *)&result);
          if (nConnectTimeout < 1) {
            nConnectTimeout = 5000;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"-peertimeout",(allocator<char> *)&blockman_opts_dummy);
          (anonymous_namespace)::peer_connect_timeout =
               ArgsManager::GetIntArg(args,(string *)&result,0x3c);
          std::__cxx11::string::~string((string *)&result);
          if ((anonymous_namespace)::peer_connect_timeout < 1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_258,"peertimeout must be a positive integer.",
                       (allocator<char> *)&blockman_opts_dummy);
            original_04._M_string_length = (size_type)args;
            original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
            original_04.field_2._M_allocated_capacity._0_4_ = chain;
            original_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
            original_04.field_2._8_8_ = in_stack_fffffffffffffb70;
            Untranslated((bilingual_str *)&result,original_04);
            bVar3 = InitError((bilingual_str *)&result);
            bilingual_str::~bilingual_str((bilingual_str *)&result);
            pOVar10 = (Options *)local_258;
LAB_006f2819:
            std::__cxx11::string::~string((string *)pOVar10);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,"-blockmintxfee",(allocator<char> *)&blockman_opts_dummy);
            bVar4 = ArgsManager::IsArgSet(args,(string *)&result);
            std::__cxx11::string::~string((string *)&result);
            if (bVar4) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&blockman_opts_dummy,"-blockmintxfee",
                         (allocator<char> *)&filter_type);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&names,"",(allocator<char> *)&local_468);
              opts = (uint *)&names;
              ArgsManager::GetArg((string *)&result,args,(string *)&blockman_opts_dummy,
                                  (string *)opts);
              oVar16 = ParseMoney((string *)&result);
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::string::~string((string *)&names);
              std::__cxx11::string::~string((string *)&blockman_opts_dummy);
              if (((undefined1  [16])
                   oVar16.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&blockman_opts_dummy,"blockmintxfee",
                           (allocator<char> *)&stack0xfffffffffffffb88);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filter_type,"-blockmintxfee",
                           (allocator<char> *)&stack0xfffffffffffffb97);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_468,"",(allocator<char> *)&stack0xfffffffffffffb96);
                ArgsManager::GetArg((string *)&names,args,(string *)&filter_type,&local_468.original
                                   );
                common::AmountErrMsg
                          ((bilingual_str *)&result,(string *)&blockman_opts_dummy,(string *)&names)
                ;
                bVar3 = InitError((bilingual_str *)&result);
                bilingual_str::~bilingual_str((bilingual_str *)&result);
                std::__cxx11::string::~string((string *)&names);
                std::__cxx11::string::~string((string *)&local_468);
                std::__cxx11::string::~string((string *)&filter_type);
                pOVar10 = &blockman_opts_dummy;
                goto LAB_006f2819;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,"-bytespersigop",(allocator<char> *)&blockman_opts_dummy);
            iVar8 = ArgsManager::GetIntArg(args,(string *)&result,(ulong)nBytesPerSigOp);
            nBytesPerSigOp = (uint)iVar8;
            std::__cxx11::string::~string((string *)&result);
            iVar5 = (*g_wallet_init_interface->_vptr_WalletInitInterface[2])();
            if ((char)iVar5 == '\0') {
              bVar3 = false;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"-mocktime",(allocator<char> *)&blockman_opts_dummy);
              iVar8 = ArgsManager::GetIntArg(args,(string *)&result,0);
              SetMockTime(iVar8);
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"-peerbloomfilters",
                         (allocator<char> *)&blockman_opts_dummy);
              bVar4 = ArgsManager::GetBoolArg(args,(string *)&result,false);
              std::__cxx11::string::~string((string *)&result);
              if (bVar4) {
                (anonymous_namespace)::nLocalServices._0_1_ =
                     (byte)(anonymous_namespace)::nLocalServices | 4;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"-test",(allocator<char> *)&blockman_opts_dummy);
              bVar4 = ArgsManager::IsArgSet(args,(string *)&result);
              std::__cxx11::string::~string((string *)&result);
              if (bVar4) {
                if (pCVar6->m_chain_type != REGTEST) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_278,"-test=<option> can only be used with regtest",
                             (allocator<char> *)&blockman_opts_dummy);
                  original_05._M_string_length = (size_type)args;
                  original_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
                  original_05.field_2._M_allocated_capacity._0_4_ = chain;
                  original_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffb6c;
                  original_05.field_2._8_8_ = in_stack_fffffffffffffb70;
                  Untranslated((bilingual_str *)&result,original_05);
                  bVar3 = InitError((bilingual_str *)&result);
                  bilingual_str::~bilingual_str((bilingual_str *)&result);
                  pOVar10 = (Options *)local_278;
                  goto LAB_006f2819;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&result,"-test",(allocator<char> *)&blockman_opts_dummy);
                ArgsManager::GetArgs(&names,args,(string *)&result);
                std::__cxx11::string::~string((string *)&result);
                pbVar21 = names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                while (names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start != pbVar21) {
                  uVar18 = SUB84(names.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0);
                  uVar19 = (undefined4)
                           ((ulong)names.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                  lVar13 = (long)TEST_OPTIONS_DOC_abi_cxx11_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)TEST_OPTIONS_DOC_abi_cxx11_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  __it._M_current =
                       TEST_OPTIONS_DOC_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  _Var14._M_current =
                       TEST_OPTIONS_DOC_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                       names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  for (lVar15 = lVar13 >> 7; 0 < lVar15; lVar15 = lVar15 + -1) {
                    pbVar20 = _Var14._M_current;
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it);
                    _Var14._M_current = __it._M_current;
                    if (bVar4) goto LAB_006f2d8f;
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it._M_current + 1);
                    _Var14._M_current = __it._M_current + 1;
                    if (bVar4) goto LAB_006f2d8f;
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it._M_current + 2);
                    _Var14._M_current = __it._M_current + 2;
                    if (bVar4) goto LAB_006f2d8f;
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it._M_current + 3);
                    _Var14._M_current = __it._M_current + 3;
                    if (bVar4) goto LAB_006f2d8f;
                    __it._M_current = __it._M_current + 4;
                    lVar13 = lVar13 + -0x80;
                    _Var14._M_current = pbVar20;
                  }
                  lVar13 = lVar13 >> 5;
                  if (lVar13 == 1) {
                    pbVar11 = (bilingual_str *)CONCAT44(uVar19,uVar18);
                    __it_00._M_current = __it._M_current;
LAB_006f2deb:
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it_00);
                    __it._M_current = _Var14._M_current;
                    if (bVar4) {
                      __it._M_current = __it_00._M_current;
                    }
                  }
                  else if (lVar13 == 2) {
                    pbVar11 = (bilingual_str *)CONCAT44(uVar19,uVar18);
LAB_006f2d68:
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it);
                    if (!bVar4) {
                      __it_00._M_current = __it._M_current + 1;
                      goto LAB_006f2deb;
                    }
                  }
                  else if (lVar13 == 3) {
                    bVar4 = __gnu_cxx::__ops::
                            _Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::$_0>::
                            operator()((_Iter_pred<AppInitParameterInteraction(ArgsManager_const&)::__0>
                                        *)&result,__it);
                    pbVar11 = (bilingual_str *)CONCAT44(uVar19,uVar18);
                    if (!bVar4) {
                      __it._M_current = __it._M_current + 1;
                      goto LAB_006f2d68;
                    }
                  }
                  else {
LAB_006f2d8f:
                    pbVar11 = (bilingual_str *)CONCAT44(uVar19,uVar18);
                    __it._M_current = _Var14._M_current;
                  }
                  if (__it._M_current ==
                      TEST_OPTIONS_DOC_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xcaabd3);
                    tinyformat::format<std::__cxx11::string>
                              ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,pbVar11,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               opts);
                    InitWarning((bilingual_str *)&result);
                    bilingual_str::~bilingual_str((bilingual_str *)&result);
                    bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
                  }
                  names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = &pbVar11->translated;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&names);
              }
              this = (path *)(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _M_first._M_storage._M_storage + 8);
              this_00 = args;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = pCVar6;
              ArgsManager::GetDataDirNet((path *)this,args);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x34] = '\0';
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x38] = '\x01';
              node::ApplyArgsManOptions
                        ((Result<void> *)&names,(node *)args,(ArgsManager *)&result,(Options *)opts)
              ;
              if (local_350 == '\x01') {
                blockman_opts_dummy.chainparams =
                     (CChainParams *)
                     result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_;
                blockman_opts_dummy.use_xor = true;
                blockman_opts_dummy.prune_target = 0;
                blockman_opts_dummy.fast_prune = false;
                ArgsManager::GetBlocksDirPath(&blockman_opts_dummy.blocks_dir,this_00);
                blockman_opts_dummy.notifications = (Notifications *)&stack0xfffffffffffffb88;
                node::ApplyArgsManOptions((Result<void> *)&filter_type,this_00,&blockman_opts_dummy)
                ;
                bVar4 = local_3e8 == '\x01';
                if (!bVar4) {
                  util::ErrorString<void>(&local_468,(Result<void> *)&filter_type);
                  bVar3 = InitError(&local_468);
                  bilingual_str::~bilingual_str(&local_468);
                }
                std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
                ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)
                                  &filter_type);
                std::filesystem::__cxx11::path::~path(&blockman_opts_dummy.blocks_dir.super_path);
              }
              else {
                util::ErrorString<void>
                          ((bilingual_str *)&blockman_opts_dummy,(Result<void> *)&names);
                bVar3 = InitError((bilingual_str *)&blockman_opts_dummy);
                bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
                bVar4 = false;
              }
              bVar3 = (bool)(bVar3 | bVar4);
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&names);
              std::filesystem::__cxx11::path::~path(this);
            }
          }
        }
      }
    }
LAB_006f276e:
    std::__cxx11::string::~string((string *)&blockfilterindex_value);
  }
  else {
    _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xcaa907);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filter_type,"-blocksdir",(allocator<char> *)&blockfilterindex_value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"",(allocator<char> *)&stack0xfffffffffffffb88);
    pbVar11 = &local_468;
    ArgsManager::GetArg((string *)&names,args,(string *)&filter_type,&pbVar11->original);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,(bilingual_str *)&names,
               &pbVar11->original);
    bVar3 = InitError((bilingual_str *)&result);
    bilingual_str::~bilingual_str((bilingual_str *)&result);
    std::__cxx11::string::~string((string *)&names);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&filter_type);
    bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
  }
  bilingual_str::~bilingual_str(&warnings);
LAB_006f2788:
  bilingual_str::~bilingual_str(&errors);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool AppInitParameterInteraction(const ArgsManager& args)
{
    const CChainParams& chainparams = Params();
    // ********************************************************* Step 2: parameter interactions

    // also see: InitParameterInteraction()

    // Error if network-specific options (-addnode, -connect, etc) are
    // specified in default section of config file, but not overridden
    // on the command line or in this chain's section of the config file.
    ChainType chain = args.GetChainType();
    if (chain == ChainType::SIGNET) {
        LogPrintf("Signet derived magic (message start): %s\n", HexStr(chainparams.MessageStart()));
    }
    bilingual_str errors;
    for (const auto& arg : args.GetUnsuitableSectionOnlyArgs()) {
        errors += strprintf(_("Config setting for %s only applied on %s network when in [%s] section.") + Untranslated("\n"), arg, ChainTypeToString(chain), ChainTypeToString(chain));
    }

    if (!errors.empty()) {
        return InitError(errors);
    }

    // Testnet3 deprecation warning
    if (chain == ChainType::TESTNET) {
        LogInfo("Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n");
    }

    // Warn if unrecognized section name are present in the config file.
    bilingual_str warnings;
    for (const auto& section : args.GetUnrecognizedSections()) {
        warnings += strprintf(Untranslated("%s:%i ") + _("Section [%s] is not recognized.") + Untranslated("\n"), section.m_file, section.m_line, section.m_name);
    }

    if (!warnings.empty()) {
        InitWarning(warnings);
    }

    if (!fs::is_directory(args.GetBlocksDirPath())) {
        return InitError(strprintf(_("Specified blocks directory \"%s\" does not exist."), args.GetArg("-blocksdir", "")));
    }

    // parse and validate enabled filter types
    std::string blockfilterindex_value = args.GetArg("-blockfilterindex", DEFAULT_BLOCKFILTERINDEX);
    if (blockfilterindex_value == "" || blockfilterindex_value == "1") {
        g_enabled_filter_types = AllBlockFilterTypes();
    } else if (blockfilterindex_value != "0") {
        const std::vector<std::string> names = args.GetArgs("-blockfilterindex");
        for (const auto& name : names) {
            BlockFilterType filter_type;
            if (!BlockFilterTypeByName(name, filter_type)) {
                return InitError(strprintf(_("Unknown -blockfilterindex value %s."), name));
            }
            g_enabled_filter_types.insert(filter_type);
        }
    }

    // Signal NODE_P2P_V2 if BIP324 v2 transport is enabled.
    if (args.GetBoolArg("-v2transport", DEFAULT_V2_TRANSPORT)) {
        nLocalServices = ServiceFlags(nLocalServices | NODE_P2P_V2);
    }

    // Signal NODE_COMPACT_FILTERS if peerblockfilters and basic filters index are both enabled.
    if (args.GetBoolArg("-peerblockfilters", DEFAULT_PEERBLOCKFILTERS)) {
        if (g_enabled_filter_types.count(BlockFilterType::BASIC) != 1) {
            return InitError(_("Cannot set -peerblockfilters without -blockfilterindex."));
        }

        nLocalServices = ServiceFlags(nLocalServices | NODE_COMPACT_FILTERS);
    }

    if (args.GetIntArg("-prune", 0)) {
        if (args.GetBoolArg("-txindex", DEFAULT_TXINDEX))
            return InitError(_("Prune mode is incompatible with -txindex."));
        if (args.GetBoolArg("-reindex-chainstate", false)) {
            return InitError(_("Prune mode is incompatible with -reindex-chainstate. Use full -reindex instead."));
        }
    }

    // If -forcednsseed is set to true, ensure -dnsseed has not been set to false
    if (args.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED) && !args.GetBoolArg("-dnsseed", DEFAULT_DNSSEED)){
        return InitError(_("Cannot set -forcednsseed to true when setting -dnsseed to false."));
    }

    // -bind and -whitebind can't be set when not listening
    size_t nUserBind = args.GetArgs("-bind").size() + args.GetArgs("-whitebind").size();
    if (nUserBind != 0 && !args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        return InitError(Untranslated("Cannot set -bind or -whitebind together with -listen=0"));
    }

    // if listen=0, then disallow listenonion=1
    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN) && args.GetBoolArg("-listenonion", DEFAULT_LISTEN_ONION)) {
        return InitError(Untranslated("Cannot set -listen=0 together with -listenonion=1"));
    }

    // Make sure enough file descriptors are available
    int nBind = std::max(nUserBind, size_t(1));
    nUserMaxConnections = args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS);
    nMaxConnections = std::max(nUserMaxConnections, 0);

    nFD = RaiseFileDescriptorLimit(nMaxConnections + MIN_CORE_FILEDESCRIPTORS + MAX_ADDNODE_CONNECTIONS + nBind + NUM_FDS_MESSAGE_CAPTURE);

#ifdef USE_POLL
    int fd_max = nFD;
#else
    int fd_max = FD_SETSIZE;
#endif
    // Trim requested connection counts, to fit into system limitations
    // <int> in std::min<int>(...) to work around FreeBSD compilation issue described in #2695
    nMaxConnections = std::max(std::min<int>(nMaxConnections, fd_max - nBind - MIN_CORE_FILEDESCRIPTORS - MAX_ADDNODE_CONNECTIONS - NUM_FDS_MESSAGE_CAPTURE), 0);
    if (nFD < MIN_CORE_FILEDESCRIPTORS)
        return InitError(_("Not enough file descriptors available."));
    nMaxConnections = std::min(nFD - MIN_CORE_FILEDESCRIPTORS - MAX_ADDNODE_CONNECTIONS - NUM_FDS_MESSAGE_CAPTURE, nMaxConnections);

    if (nMaxConnections < nUserMaxConnections)
        InitWarning(strprintf(_("Reducing -maxconnections from %d to %d, because of system limitations."), nUserMaxConnections, nMaxConnections));

    // ********************************************************* Step 3: parameter-to-internal-flags
    if (auto result{init::SetLoggingCategories(args)}; !result) return InitError(util::ErrorString(result));
    if (auto result{init::SetLoggingLevel(args)}; !result) return InitError(util::ErrorString(result));

    nConnectTimeout = args.GetIntArg("-timeout", DEFAULT_CONNECT_TIMEOUT);
    if (nConnectTimeout <= 0) {
        nConnectTimeout = DEFAULT_CONNECT_TIMEOUT;
    }

    peer_connect_timeout = args.GetIntArg("-peertimeout", DEFAULT_PEER_CONNECT_TIMEOUT);
    if (peer_connect_timeout <= 0) {
        return InitError(Untranslated("peertimeout must be a positive integer."));
    }

    // Sanity check argument for min fee for including tx in block
    // TODO: Harmonize which arguments need sanity checking and where that happens
    if (args.IsArgSet("-blockmintxfee")) {
        if (!ParseMoney(args.GetArg("-blockmintxfee", ""))) {
            return InitError(AmountErrMsg("blockmintxfee", args.GetArg("-blockmintxfee", "")));
        }
    }

    nBytesPerSigOp = args.GetIntArg("-bytespersigop", nBytesPerSigOp);

    if (!g_wallet_init_interface.ParameterInteraction()) return false;

    // Option to startup with mocktime set (used for regression testing):
    SetMockTime(args.GetIntArg("-mocktime", 0)); // SetMockTime(0) is a no-op

    if (args.GetBoolArg("-peerbloomfilters", DEFAULT_PEERBLOOMFILTERS))
        nLocalServices = ServiceFlags(nLocalServices | NODE_BLOOM);

    if (args.IsArgSet("-test")) {
        if (chainparams.GetChainType() != ChainType::REGTEST) {
            return InitError(Untranslated("-test=<option> can only be used with regtest"));
        }
        const std::vector<std::string> options = args.GetArgs("-test");
        for (const std::string& option : options) {
            auto it = std::find_if(TEST_OPTIONS_DOC.begin(), TEST_OPTIONS_DOC.end(), [&option](const std::string& doc_option) {
                size_t pos = doc_option.find(" (");
                return (pos != std::string::npos) && (doc_option.substr(0, pos) == option);
            });
            if (it == TEST_OPTIONS_DOC.end()) {
                InitWarning(strprintf(_("Unrecognised option \"%s\" provided in -test=<option>."), option));
            }
        }
    }

    // Also report errors from parsing before daemonization
    {
        kernel::Notifications notifications{};
        ChainstateManager::Options chainman_opts_dummy{
            .chainparams = chainparams,
            .datadir = args.GetDataDirNet(),
            .notifications = notifications,
        };
        auto chainman_result{ApplyArgsManOptions(args, chainman_opts_dummy)};
        if (!chainman_result) {
            return InitError(util::ErrorString(chainman_result));
        }
        BlockManager::Options blockman_opts_dummy{
            .chainparams = chainman_opts_dummy.chainparams,
            .blocks_dir = args.GetBlocksDirPath(),
            .notifications = chainman_opts_dummy.notifications,
        };
        auto blockman_result{ApplyArgsManOptions(args, blockman_opts_dummy)};
        if (!blockman_result) {
            return InitError(util::ErrorString(blockman_result));
        }
    }

    return true;
}